

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

void ssh1_channel_close_local(ssh1_channel *c,char *reason)

{
  ssh1_connection_state *psVar1;
  LogContext *ctx;
  char *ptr;
  Channel *pCVar2;
  char *pcVar3;
  
  psVar1 = c->connlayer;
  ptr = (*c->chan->vt->log_close_msg)(c->chan);
  if (ptr != (char *)0x0) {
    ctx = (psVar1->ppl).logctx;
    pcVar3 = " ";
    if (reason == (char *)0x0) {
      pcVar3 = anon_var_dwarf_323fc + 10;
      reason = anon_var_dwarf_323fc + 10;
    }
    pcVar3 = dupprintf("%s%s%s",ptr,pcVar3,reason);
    logevent_and_free(ctx,pcVar3);
    safefree(ptr);
  }
  (*c->chan->vt->free)(c->chan);
  pCVar2 = zombiechan_new();
  c->chan = pCVar2;
  return;
}

Assistant:

static void ssh1_channel_close_local(struct ssh1_channel *c,
                                     const char *reason)
{
    struct ssh1_connection_state *s = c->connlayer;
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    char *msg = chan_log_close_msg(c->chan);

    if (msg != NULL) {
        ppl_logevent("%s%s%s", msg, reason ? " " : "", reason ? reason : "");
        sfree(msg);
    }

    chan_free(c->chan);
    c->chan = zombiechan_new();
}